

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightconf_sample.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr *pp_Var3;
  byte bVar4;
  pointer ppVar5;
  bool bVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  value *pvVar10;
  ostream *poVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  string *psVar15;
  person *x;
  pointer ppVar16;
  ulong uVar17;
  permission *p;
  pointer ppVar18;
  char *pcVar19;
  vector<person,_std::allocator<person>_> users;
  string command;
  string source;
  string filename;
  group *parent_group;
  ofstream stream;
  undefined1 local_388 [40];
  vector<person,_std::allocator<person>_> local_360;
  path local_348;
  group local_328;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2a8;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  pointer local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  group *local_240;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  vector<permission,_std::allocator<permission>_> local_1f0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined8 auStack_150 [2];
  ios_base local_140 [272];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "lightconf sample program usage:\n  lightconf_sample [command] [args]\n\nCommands\n--------\nsetmaintainer <name>\n   Set the name of the maintainer of the user config file\nadduser <uid> <firstname> <lastname> <permissions> <mm> <dd> <yyyy>\n   Add a new user to the config file\n     uid         The user\'s unique identification number\n     firstname   The first name of the user\n     lastname    The last name of the user\n     permissions A string optionally containing the letters \'R\', \'C\', \'U\', and \'D\' for\n                 Read, Create, Update, and Delete permissions respectively\n     mm dd yyyy  The date on which the user joined the system\ndeluser <uid>\n   Delete the specified user from the system\nprint\n   Print the current state of the system\n"
               ,0x2e9);
    iVar8 = 1;
  }
  else {
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"users.config","");
    p_Var1 = &local_328.values_._M_t._M_impl.super__Rb_tree_header;
    local_328.values_._M_t._M_impl._0_8_ = 0;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_328.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_328.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_328.order_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288[0] = local_278;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
    std::ifstream::ifstream(local_238,(string *)local_260,_S_in);
    if ((*(byte *)((long)&local_220._M_string_length + *(size_type *)((long)local_238 + -0x18)) & 5)
        == 0) {
      pp_Var3 = &local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_2d8._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_2d8,
                 *(undefined8 *)((long)auStack_150 + *(size_type *)((long)local_238 + -0x18)),
                 0xffffffff,0,0xffffffff);
      std::__cxx11::string::operator=((string *)local_288,(string *)&local_2d8);
      sVar12 = extraout_RDX;
      if ((_Base_ptr *)local_2d8._M_impl._0_8_ != pp_Var3) {
        operator_delete((void *)local_2d8._M_impl._0_8_);
        sVar12 = extraout_RDX_00;
      }
      lightconf::config_format::read((int)&local_2d8,local_288,sVar12);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
               *)&local_328);
      local_388._16_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_388._8_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_388._0_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var2 = &local_2d8._M_impl.super__Rb_tree_header;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_color;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var1->_M_header;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_2d8._M_impl.super__Rb_tree_header._M_node_count;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      p_Var2 = &local_2d8._M_impl.super__Rb_tree_header;
      local_2d8._M_impl._0_8_ = (_Base_ptr *)0x0;
      local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      vStack_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_2d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
               *)&local_328);
      local_388._16_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_388._8_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_388._0_8_ =
           local_328.order_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_color;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_2d8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var1->_M_header;
        local_328.values_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_2d8._M_impl.super__Rb_tree_header._M_node_count;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_2d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_328.order_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    vStack_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_2a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
    ::~_Rb_tree(&local_2d8);
    std::ifstream::~ifstream(local_238);
    std::__cxx11::string::string((string *)&local_2d8,argv[1],(allocator *)local_238);
    lightconf::path::path((path *)local_388,"users",'.');
    local_348.parts_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_348.parts_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_348.parts_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228 = (undefined1  [8])0x0;
    local_238 = (undefined1  [8])0x0;
    _Stack_230._M_p = (pointer)0x0;
    pvVar10 = lightconf::group::
              find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (&local_328,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_388._0_8_,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_388._8_8_,&local_240,(path *)local_238);
    if ((pvVar10 == (value *)0x0) || (pvVar10->type_ != vector_type)) {
      std::vector<person,_std::allocator<person>_>::vector
                (&local_360,(vector<person,_std::allocator<person>_> *)&local_348);
    }
    else {
      lightconf::value_type_info<std::vector<person,_std::allocator<person>_>_>::extract_value
                (&local_360,pvVar10);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    std::vector<person,_std::allocator<person>_>::~vector
              ((vector<person,_std::allocator<person>_> *)&local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
    if (iVar8 == 0) {
      if (argc != 3) {
        std::operator<<((ostream *)&std::cout,"Incorrect arguments\n");
LAB_0010aba8:
        exit(1);
      }
      lightconf::path::path((path *)local_388,"global.maintainer",'.');
      std::__cxx11::string::string((string *)local_238,argv[2],(allocator *)&local_348);
      lightconf::group::set<std::__cxx11::string>
                (&local_328,(path *)local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_388);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maintainer set to ",0x12);
      pcVar19 = argv[2];
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x122158);
      }
      else {
        sVar12 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".\n",2);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
      if (iVar8 == 0) {
        if (argc != 9) {
          std::operator<<((ostream *)&std::cout,"Incorrect arguments\n");
          goto LAB_0010aba8;
        }
        _Stack_230._M_p = (pointer)&local_220;
        local_228 = (undefined1  [8])0x0;
        local_220._M_dataplus._M_p._0_1_ = '\0';
        local_220.field_2._M_allocated_capacity = (size_type)&local_200;
        local_220.field_2._8_8_ = (char *)0x0;
        local_200._M_local_buf[0] = '\0';
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_finish = (permission *)0x0;
        local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (permission *)0x0;
        iVar8 = atoi(argv[2]);
        local_238._0_4_ = iVar8;
        pcVar19 = argv[3];
        strlen(pcVar19);
        std::__cxx11::string::_M_replace((ulong)&_Stack_230,0,(char *)0x0,(ulong)pcVar19);
        uVar7 = local_220.field_2._8_8_;
        pcVar19 = argv[4];
        strlen(pcVar19);
        std::__cxx11::string::_M_replace((ulong)&local_220.field_2,0,(char *)uVar7,(ulong)pcVar19);
        pcVar19 = argv[5];
        if (*pcVar19 != '\0') {
          uVar13 = 0;
          uVar17 = 1;
          do {
            bVar4 = pcVar19[uVar13];
            if (bVar4 < 0x52) {
              if (bVar4 == 0x43) {
                local_388._0_4_ = 1;
                if (local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<permission,_std::allocator<permission>_>::
                  _M_realloc_insert<permission>
                            (&local_1f0,
                             (iterator)
                             local_1f0.super__Vector_base<permission,_std::allocator<permission>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(permission *)local_388);
                }
                else {
                  *local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                   super__Vector_impl_data._M_finish = CREATE;
LAB_0010a732:
                  local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl
                       .super__Vector_impl_data._M_finish + 1;
                }
              }
              else if (bVar4 == 0x44) {
                local_388._0_4_ = 2;
                if (local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                   super__Vector_impl_data._M_finish = DELETE;
                  goto LAB_0010a732;
                }
                std::vector<permission,_std::allocator<permission>_>::_M_realloc_insert<permission>
                          (&local_1f0,
                           (iterator)
                           local_1f0.super__Vector_base<permission,_std::allocator<permission>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(permission *)local_388);
              }
              else {
LAB_0010a68b:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Unknown permission letter: ",0x1b);
                local_388._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_388 + 0x10);
                std::__cxx11::string::_M_construct((ulong)local_388,'\x01');
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)local_388._0_8_,local_388._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_388._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_388 + 0x10)) {
                  operator_delete((void *)local_388._0_8_);
                }
              }
            }
            else if (bVar4 == 0x55) {
              local_388._0_4_ = 3;
              if (local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                 super__Vector_impl_data._M_finish = UPDATE;
                goto LAB_0010a732;
              }
              std::vector<permission,_std::allocator<permission>_>::_M_realloc_insert<permission>
                        (&local_1f0,
                         (iterator)
                         local_1f0.super__Vector_base<permission,_std::allocator<permission>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(permission *)local_388);
            }
            else {
              if (bVar4 != 0x52) goto LAB_0010a68b;
              local_388._0_8_ = (ulong)(uint)local_388._4_4_ << 0x20;
              if (local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                 super__Vector_impl_data._M_finish = READ;
                goto LAB_0010a732;
              }
              std::vector<permission,_std::allocator<permission>_>::_M_realloc_insert<permission>
                        (&local_1f0,
                         (iterator)
                         local_1f0.super__Vector_base<permission,_std::allocator<permission>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(permission *)local_388);
            }
            pcVar19 = argv[5];
            sVar12 = strlen(pcVar19);
            bVar6 = uVar17 < sVar12;
            uVar13 = uVar17;
            uVar17 = (ulong)((int)uVar17 + 1);
          } while (bVar6);
        }
        iVar9 = atoi(argv[6]);
        local_1d4 = iVar9;
        iVar8 = atoi(argv[7]);
        local_1d8 = iVar8;
        local_1d0 = atoi(argv[8]);
        if (iVar9 - 0x20U < 0xffffffe1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Day out of range [1-31], adjusted to 1.\n",0x28);
          local_1d4 = 1;
          iVar8 = local_1d8;
        }
        if (iVar8 - 0xdU < 0xfffffff4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Month out of range [1-12], adjusted to 1.\n",0x2a);
          local_1d8 = 1;
        }
        if (local_1d0 - 0x834U < 0xffffff7e) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Year out of range [1970-2099], adjusted to 1970.\n",0x31
                    );
          local_1d0 = 0x7b2;
        }
        if (local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            if ((local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                 super__Vector_impl_data._M_start)->userid == local_238._0_4_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"User id already exists.\n",0x18);
              goto LAB_0010a97d;
            }
            local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          } while (local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        std::vector<person,_std::allocator<person>_>::push_back(&local_360,(value_type *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"User added.\n",0xc);
LAB_0010a97d:
        if (local_1f0.super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.super__Vector_base<permission,_std::allocator<permission>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.field_2._0_8_ != &local_200) {
          operator_delete((void *)local_220.field_2._0_8_);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_230._M_p !=
            &local_220) {
          operator_delete(_Stack_230._M_p);
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
        if (iVar8 == 0) {
          if (argc != 3) {
            std::operator<<((ostream *)&std::cout,"Incorrect arguments\n");
            goto LAB_0010aba8;
          }
          iVar8 = atoi(argv[2]);
          if ((long)local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar13 = ((long)local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
            uVar14 = 1;
            uVar17 = 0;
            do {
              if (local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17].userid == iVar8) {
                std::vector<person,_std::allocator<person>_>::_M_erase
                          (&local_360,
                           local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar17);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"User deleted.\n",0xe);
                goto LAB_0010a9ea;
              }
              uVar17 = (ulong)uVar14;
              uVar14 = uVar14 + 1;
            } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"User not found.\n",0x10);
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
          if (iVar8 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Maintainer: ",0xc);
            lightconf::path::path(&local_348,"global.maintainer",'.');
            local_238 = (undefined1  [8])local_228;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"<not set>","");
            local_388._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_388._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_388._16_8_ = (pointer)0x0;
            pvVar10 = lightconf::group::
                      find_value<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                (&local_328,
                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_348.parts_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_348.parts_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_240,
                                 (path *)local_388);
            psVar15 = (string *)local_238;
            if (pvVar10 != (value *)0x0) {
              psVar15 = (string *)local_238;
              if (pvVar10->type_ == string_type) {
                psVar15 = (string *)&pvVar10->string_value_;
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_388);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)psVar15,*(long *)(psVar15 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (local_238 != (undefined1  [8])local_228) {
              operator_delete((void *)local_238);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_348.parts_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Users:\n",7);
            local_268 = local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            ppVar16 = local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_360.super__Vector_base<person,_std::allocator<person>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    name:        ",0x11);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(ppVar16->firstname)._M_dataplus._M_p,
                                     (ppVar16->firstname)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(ppVar16->lastname)._M_dataplus._M_p,
                                     (ppVar16->lastname)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    uid:         ",0x11);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ppVar16->userid)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    permissions: ",0x11);
                ppVar5 = (ppVar16->perms).
                         super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (ppVar18 = (ppVar16->perms).
                               super__Vector_base<permission,_std::allocator<permission>_>._M_impl.
                               super__Vector_impl_data._M_start; ppVar18 != ppVar5;
                    ppVar18 = ppVar18 + 1) {
                  uVar13 = (ulong)*ppVar18;
                  if (uVar13 < 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               &DAT_0011aa84 + *(int *)(&DAT_0011aa84 + uVar13 * 4),
                               *(long *)(&DAT_0011ab08 + uVar13 * 8));
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    join date:   ",0x11);
                poVar11 = (ostream *)
                          std::ostream::operator<<((ostream *)&std::cout,(ppVar16->joindate).month);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ppVar16->joindate).day);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(ppVar16->joindate).year);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                ppVar16 = ppVar16 + 1;
              } while (ppVar16 != local_268);
            }
          }
        }
      }
    }
LAB_0010a9ea:
    lightconf::path::path((path *)local_238,"users",'.');
    lightconf::group::set<std::vector<person,std::allocator<person>>>
              (&local_328,(path *)local_238,&local_360);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    std::ofstream::ofstream(local_238,(string *)local_260,_S_out);
    if ((*(byte *)((long)&local_220._M_string_length + *(size_type *)((long)local_238 + -0x18)) & 5)
        == 0) {
      lightconf::config_format::write((config_format *)local_388,(int)&local_328,local_288,0x50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,(char *)local_388._0_8_,local_388._8_8_);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Configuration saved.",0x14);
    }
    local_238 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_238 + _VTT[-1]._M_string_length) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&_Stack_230);
    std::ios_base::~ios_base(local_140);
    std::vector<person,_std::allocator<person>_>::~vector(&local_360);
    if ((_Base_ptr *)local_2d8._M_impl._0_8_ !=
        &local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_2d8._M_impl._0_8_);
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0]);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328.order_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                 *)&local_328);
    iVar8 = 0;
    if (local_260[0] != local_250) {
      operator_delete(local_260[0]);
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        usage();
        return 1;
    }

    std::string filename = "users.config";
    lightconf::group config_group;
    std::string source = "";
    try {
        std::ifstream stream(filename, std::ios::in);
        if (stream) {
            // If the file exists, load the configuration group from it
            source = std::string(std::istreambuf_iterator<char>(stream),
                std::istreambuf_iterator<char>());
            config_group = lightconf::config_format::read(source);
        } else {
            // If the file does not exist, just create an empty group
            config_group = lightconf::group();
        }
    } catch (const lightconf::parse_error& e) {
        std::cout << "Parse error (" << e.line() << ":" << e.col() << "): " << e.what();
        return 1;
    } catch (const std::exception& e) {
        std::cout << "Failed to read configuration file: " << e.what();
        return 1;
    }

    std::string command(argv[1]);
    std::vector<person> users = config_group.get<std::vector<person>>("users", {});

    if (command == "setmaintainer") {
        if (argc != 3) argfail();

        // Keys can be specified using full paths, and nonexistant parent groups will
        // be automatically created.
        config_group.set<std::string>("global.maintainer", argv[2]);
        std::cout << "Maintainer set to " << argv[2] << ".\n";
    } else if (command == "adduser") {
        if (argc != 9) argfail();
        person p;
        p.userid = atoi(argv[2]);
        p.firstname = argv[3];
        p.lastname = argv[4];
        for (unsigned int i = 0; i < strlen(argv[5]); i++) {
            if (argv[5][i] == 'R') p.perms.push_back(permission::READ);
            else if (argv[5][i] == 'C') p.perms.push_back(permission::CREATE);
            else if (argv[5][i] == 'U') p.perms.push_back(permission::UPDATE);
            else if (argv[5][i] == 'D') p.perms.push_back(permission::DELETE);
            else std::cout << "Unknown permission letter: " << std::string(1, argv[5][i]) << "\n";
        }
        p.joindate.day = atoi(argv[6]);
        p.joindate.month = atoi(argv[7]);
        p.joindate.year = atoi(argv[8]);

        if (p.joindate.day < 1 || p.joindate.day > 31) {
            std::cout << "Day out of range [1-31], adjusted to 1.\n";
            p.joindate.day = 1;
        }
        if (p.joindate.month < 1 || p.joindate.month > 12) {
            std::cout << "Month out of range [1-12], adjusted to 1.\n";
            p.joindate.month = 1;
        }
        if (p.joindate.year < 1970 || p.joindate.year > 2099) {
            std::cout << "Year out of range [1970-2099], adjusted to 1970.\n";
            p.joindate.year = 1970;
        }

        for (const auto& x : users) {
            if (x.userid == p.userid) {
                std::cout << "User id already exists.\n";
                goto save;
            }
        }
        users.push_back(p);
        std::cout << "User added.\n";
    } else if (command == "deluser") {
        if (argc != 3) argfail();
        int uid = atoi(argv[2]);
        for (unsigned int i = 0; i < users.size(); i++) {
            if (users[i].userid == uid) {
                users.erase(std::begin(users) + i);
                std::cout << "User deleted.\n";
                goto save;
            }
        }
        std::cout << "User not found.\n";
    } else if (command == "print") {
        std::cout << "Maintainer: "
            << config_group.get<std::string>("global.maintainer", "<not set>") << "\n";
        std::cout << "Users:\n";
        for (const auto& x : users) {
            std::cout << "    name:        " << x.firstname << " " << x.lastname << "\n";
            std::cout << "    uid:         " << x.userid << "\n";
            std::cout << "    permissions: ";
            for (const auto& p : x.perms) {
                if (p == permission::READ) std::cout << "read ";
                else if (p == permission::CREATE) std::cout << "create ";
                else if (p == permission::UPDATE) std::cout << "update ";
                else if (p == permission::DELETE) std::cout << "delete ";
            }
            std::cout << "\n";
            std::cout << "    join date:   " << x.joindate.month << "/"
                << x.joindate.day << "/" << x.joindate.year << "\n";
            std::cout << "\n";
        }
    }

save:
    config_group.set<std::vector<person>>("users", users);
    std::ofstream stream(filename, std::ios::out);
    if (stream) {
        stream << lightconf::config_format::write(config_group, source, 80);
        std::cout << "Configuration saved.";
    }
}